

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

int __thiscall
HullLibrary::calchullgen(HullLibrary *this,cbtVector3 *verts,int verts_count,int vlimit)

{
  cbtVector3 *other;
  int *piVar1;
  undefined8 *puVar2;
  cbtInt3 *t;
  float epsilon;
  float epsilon_00;
  float fVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  cbtHullTriangle *pcVar9;
  long lVar10;
  HullLibrary *this_00;
  long lVar11;
  long lVar12;
  bool bVar13;
  cbtScalar cVar14;
  undefined1 auVar15 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 extraout_var [60];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  cbtInt4 cVar41;
  cbtVector3 cVar42;
  cbtVector3 n;
  cbtInt3 nt;
  cbtVector3 center;
  cbtVector3 bmax;
  cbtVector3 bmin;
  cbtAlignedObjectArray<int> allow;
  cbtAlignedObjectArray<int> isextreme;
  cbtVector3 local_50;
  cbtVector3 local_40;
  undefined1 auVar27 [56];
  undefined1 auVar40 [56];
  
  iVar5 = 0;
  if (3 < verts_count) {
    bmin.m_floats._0_8_ = *(undefined8 *)verts->m_floats;
    bmin.m_floats._8_8_ = *(undefined8 *)(verts->m_floats + 2);
    bmax.m_floats._0_8_ = *(undefined8 *)verts->m_floats;
    bmax.m_floats._8_8_ = *(undefined8 *)(verts->m_floats + 2);
    isextreme.m_ownsMemory = true;
    isextreme.m_data = (int *)0x0;
    isextreme.m_size = 0;
    isextreme.m_capacity = 0;
    cbtAlignedObjectArray<int>::reserve(&isextreme,verts_count);
    allow.m_ownsMemory = true;
    allow.m_data = (int *)0x0;
    allow.m_size = 0;
    allow.m_capacity = 0;
    cbtAlignedObjectArray<int>::reserve(&allow,verts_count);
    for (lVar11 = 0; (ulong)(uint)verts_count << 4 != lVar11; lVar11 = lVar11 + 0x10) {
      center.m_floats[0] = 1.4013e-45;
      cbtAlignedObjectArray<int>::push_back(&allow,(int *)&center);
      auVar4._12_4_ = 0;
      auVar4._0_4_ = center.m_floats[1];
      auVar4._4_4_ = center.m_floats[2];
      auVar4._8_4_ = center.m_floats[3];
      center.m_floats = (cbtScalar  [4])(auVar4 << 0x20);
      cbtAlignedObjectArray<int>::push_back(&isextreme,(int *)&center);
      other = (cbtVector3 *)((long)verts->m_floats + lVar11);
      cbtVector3::setMin(&bmin,other);
      cbtVector3::setMax(&bmax,other);
    }
    auVar15._8_8_ = 0;
    auVar15._0_4_ = bmax.m_floats[0];
    auVar15._4_4_ = bmax.m_floats[1];
    auVar28._8_8_ = 0;
    auVar28._0_4_ = bmin.m_floats[0];
    auVar28._4_4_ = bmin.m_floats[1];
    this_00 = (HullLibrary *)&center;
    auVar15 = vsubps_avx(auVar15,auVar28);
    auVar40 = (undefined1  [56])0x0;
    center.m_floats =
         (cbtScalar  [4])
         vinsertps_avx(auVar15,ZEXT416((uint)(bmax.m_floats[2] - bmin.m_floats[2])),0x28);
    cVar14 = cbtVector3::length((cbtVector3 *)this_00);
    auVar27 = extraout_var_00;
    cVar41 = FindSimplex(this_00,verts,verts_count,&allow);
    iVar5 = cVar41.x;
    if (iVar5 != -1) {
      lVar12 = cVar41._0_8_ >> 0x20;
      cVar42 = ::operator+(verts + iVar5,verts + lVar12);
      auVar29._0_8_ = cVar42.m_floats._8_8_;
      auVar29._8_56_ = auVar40;
      auVar16._0_8_ = cVar42.m_floats._0_8_;
      auVar16._8_56_ = auVar27;
      iVar6 = cVar41.z;
      local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar29._0_16_);
      auVar27 = ZEXT856(local_50.m_floats._8_8_);
      cVar42 = ::operator+(&local_50,verts + iVar6);
      auVar30._0_8_ = cVar42.m_floats._8_8_;
      auVar30._8_56_ = auVar40;
      auVar17._0_8_ = cVar42.m_floats._0_8_;
      auVar17._8_56_ = auVar27;
      lVar10 = cVar41._8_8_ >> 0x20;
      local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar30._0_16_);
      auVar27 = ZEXT856(local_40.m_floats._8_8_);
      cVar42 = ::operator+(&local_40,verts + lVar10);
      auVar31._0_8_ = cVar42.m_floats._8_8_;
      auVar31._8_56_ = auVar40;
      auVar18._0_8_ = cVar42.m_floats._0_8_;
      auVar18._8_56_ = auVar27;
      n.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar18._0_16_,auVar31._0_16_);
      auVar27 = ZEXT856(n.m_floats._8_8_);
      nt.x = 0x40800000;
      cVar42 = ::operator/(&n,(cbtScalar *)&nt);
      auVar34._0_8_ = cVar42.m_floats._8_8_;
      auVar34._8_56_ = auVar40;
      auVar19._0_8_ = cVar42.m_floats._0_8_;
      auVar19._8_56_ = auVar27;
      center.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19._0_16_,auVar34._0_16_);
      iVar8 = cVar41.w;
      iVar7 = cVar41.y;
      pcVar9 = allocateTriangle(this,iVar6,iVar8,iVar7);
      (pcVar9->n).x = 2;
      (pcVar9->n).y = 3;
      (pcVar9->n).z = 1;
      pcVar9 = allocateTriangle(this,iVar8,iVar6,iVar5);
      (pcVar9->n).x = 3;
      (pcVar9->n).y = 2;
      (pcVar9->n).z = 0;
      pcVar9 = allocateTriangle(this,iVar5,iVar7,iVar8);
      (pcVar9->n).x = 0;
      (pcVar9->n).y = 1;
      (pcVar9->n).z = 3;
      pcVar9 = allocateTriangle(this,iVar7,iVar5,iVar6);
      (pcVar9->n).x = 1;
      (pcVar9->n).y = 0;
      (pcVar9->n).z = 2;
      epsilon = cVar14 * 0.001;
      auVar20 = ZEXT464((uint)epsilon);
      lVar11 = 0;
      isextreme.m_data[lVar10] = 1;
      isextreme.m_data[iVar6] = 1;
      isextreme.m_data[lVar12] = 1;
      isextreme.m_data[iVar5] = 1;
      while( true ) {
        auVar40 = auVar34._8_56_;
        auVar27 = auVar20._8_56_;
        if (*(int *)(this + 4) <= lVar11) break;
        piVar1 = *(int **)(*(long *)(this + 0x10) + lVar11 * 8);
        cVar42 = TriNormal(verts + *piVar1,verts + piVar1[1],verts + piVar1[2]);
        auVar32._0_8_ = cVar42.m_floats._8_8_;
        auVar32._8_56_ = auVar40;
        auVar21._0_8_ = cVar42.m_floats._0_8_;
        auVar21._8_56_ = auVar27;
        n.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar32._0_16_);
        auVar27 = ZEXT856(n.m_floats._8_8_);
        iVar5 = maxdirsterid<cbtVector3>(verts,verts_count,&n,&allow);
        piVar1[7] = iVar5;
        cVar42 = ::operator-(verts + iVar5,verts + *piVar1);
        auVar33._0_8_ = cVar42.m_floats._8_8_;
        auVar33._8_56_ = auVar40;
        auVar20._0_8_ = cVar42.m_floats._0_8_;
        auVar20._8_56_ = auVar27;
        auVar15 = vmovshdup_avx(auVar20._0_16_);
        lVar11 = lVar11 + 1;
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * n.m_floats[1])),auVar20._0_16_,
                                  ZEXT416((uint)n.m_floats[0]));
        auVar15 = vfmadd132ss_fma(auVar33._0_16_,auVar15,ZEXT416((uint)n.m_floats[2]));
        auVar34 = ZEXT1664(auVar15);
        piVar1[8] = auVar15._0_4_;
      }
      epsilon_00 = epsilon * 0.01;
      auVar35 = ZEXT464((uint)epsilon_00);
      iVar5 = vlimit + -4;
      if (vlimit == 0) {
        iVar5 = 0x3b9ac9fc;
      }
      fVar3 = epsilon * epsilon * 0.1;
LAB_00e13ff8:
      if (0 < iVar5) {
        auVar22 = ZEXT464((uint)epsilon);
        pcVar9 = extrudable(this,epsilon);
        if (pcVar9 != (cbtHullTriangle *)0x0) {
          iVar8 = pcVar9->vmax;
          isextreme.m_data[iVar8] = 1;
          lVar11 = (long)*(int *)(this + 4);
          while (bVar13 = lVar11 != 0, lVar11 = lVar11 + -1, bVar13) {
            puVar2 = *(undefined8 **)(*(long *)(this + 0x10) + lVar11 * 8);
            if (puVar2 != (undefined8 *)0x0) {
              n.m_floats[2] = *(cbtScalar *)(puVar2 + 1);
              n.m_floats._0_8_ = *puVar2;
              auVar22 = ZEXT464((uint)epsilon_00);
              iVar6 = above(verts,(cbtInt3 *)&n,verts + iVar8,epsilon_00);
              if (iVar6 != 0) {
                extrude(this,*(cbtHullTriangle **)(*(long *)(this + 0x10) + lVar11 * 8),iVar8);
              }
            }
          }
          do {
            iVar6 = *(int *)(this + 4);
            do {
              do {
                bVar13 = iVar6 == 0;
                iVar6 = iVar6 + -1;
                if (bVar13) {
LAB_00e14197:
                  lVar11 = (long)*(int *)(this + 4);
                  goto LAB_00e141a7;
                }
                t = *(cbtInt3 **)(*(long *)(this + 0x10) + (long)iVar6 * 8);
              } while (t == (cbtInt3 *)0x0);
              iVar7 = hasvert(t,iVar8);
              if (iVar7 == 0) goto LAB_00e14197;
              nt.z = t->z;
              nt.x = t->x;
              nt.y = t->y;
              auVar22 = ZEXT464((uint)epsilon_00);
              iVar7 = above(verts,&nt,&center,epsilon_00);
              auVar40 = auVar35._8_56_;
              auVar27 = auVar22._8_56_;
              if (iVar7 != 0) break;
              lVar11 = (long)nt.y;
              cVar42 = ::operator-(verts + lVar11,verts + nt.x);
              auVar36._0_8_ = cVar42.m_floats._8_8_;
              auVar36._8_56_ = auVar40;
              auVar23._0_8_ = cVar42.m_floats._0_8_;
              auVar23._8_56_ = auVar27;
              local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar23._0_16_,auVar36._0_16_);
              auVar27 = ZEXT856(local_40.m_floats._8_8_);
              cVar42 = ::operator-(verts + nt.z,verts + lVar11);
              auVar37._0_8_ = cVar42.m_floats._8_8_;
              auVar37._8_56_ = auVar40;
              auVar24._0_8_ = cVar42.m_floats._0_8_;
              auVar24._8_56_ = auVar27;
              local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24._0_16_,auVar37._0_16_);
              auVar27 = ZEXT856(local_50.m_floats._8_8_);
              cVar42 = cbtVector3::cross(&local_40,&local_50);
              auVar38._0_8_ = cVar42.m_floats._8_8_;
              auVar38._8_56_ = auVar40;
              auVar25._0_8_ = cVar42.m_floats._0_8_;
              auVar25._8_56_ = auVar27;
              n.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar25._0_16_,auVar38._0_16_);
              auVar22._0_4_ = cbtVector3::length(&n);
              auVar22._4_60_ = extraout_var;
              auVar35 = ZEXT464((uint)fVar3);
            } while (fVar3 <= auVar22._0_4_);
            extrude(this,*(cbtHullTriangle **)
                          (*(long *)(this + 0x10) +
                          (long)*(int *)(*(long *)(*(long *)(this + 0x10) + (long)iVar6 * 8) + 0xc)
                          * 8),iVar8);
          } while( true );
        }
      }
      iVar5 = 1;
      goto LAB_00e1427c;
    }
    iVar5 = 0;
LAB_00e1427c:
    cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&allow);
    cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&isextreme);
  }
  return iVar5;
LAB_00e141a7:
  auVar40 = auVar35._8_56_;
  auVar27 = auVar22._8_56_;
  bVar13 = lVar11 != 0;
  lVar11 = lVar11 + -1;
  if (bVar13) {
    piVar1 = *(int **)(*(long *)(this + 0x10) + lVar11 * 8);
    if (piVar1 != (int *)0x0) {
      if (-1 < piVar1[7]) goto LAB_00e1426a;
      cVar42 = TriNormal(verts + *piVar1,verts + piVar1[1],verts + piVar1[2]);
      auVar35._0_8_ = cVar42.m_floats._8_8_;
      auVar35._8_56_ = auVar40;
      auVar26._0_8_ = cVar42.m_floats._0_8_;
      auVar26._8_56_ = auVar27;
      n.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar26._0_16_,auVar35._0_16_);
      auVar22 = ZEXT1664((undefined1  [16])n.m_floats);
      iVar8 = maxdirsterid<cbtVector3>(verts,verts_count,&n,&allow);
      auVar40 = auVar35._8_56_;
      auVar27 = auVar22._8_56_;
      piVar1[7] = iVar8;
      if (isextreme.m_data[iVar8] == 0) {
        cVar42 = ::operator-(verts + iVar8,verts + *piVar1);
        auVar39._0_8_ = cVar42.m_floats._8_8_;
        auVar39._8_56_ = auVar40;
        auVar22._0_8_ = cVar42.m_floats._0_8_;
        auVar22._8_56_ = auVar27;
        auVar15 = vmovshdup_avx(auVar22._0_16_);
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * n.m_floats[1])),auVar22._0_16_,
                                  ZEXT416((uint)n.m_floats[0]));
        auVar15 = vfmadd132ss_fma(auVar39._0_16_,auVar15,ZEXT416((uint)n.m_floats[2]));
        auVar35 = ZEXT1664(auVar15);
        piVar1[8] = auVar15._0_4_;
      }
      else {
        piVar1[7] = -1;
      }
    }
    goto LAB_00e141a7;
  }
LAB_00e1426a:
  iVar5 = iVar5 + -1;
  goto LAB_00e13ff8;
}

Assistant:

int HullLibrary::calchullgen(cbtVector3 *verts, int verts_count, int vlimit)
{
	if (verts_count < 4) return 0;
	if (vlimit == 0) vlimit = 1000000000;
	int j;
	cbtVector3 bmin(*verts), bmax(*verts);
	cbtAlignedObjectArray<int> isextreme;
	isextreme.reserve(verts_count);
	cbtAlignedObjectArray<int> allow;
	allow.reserve(verts_count);

	for (j = 0; j < verts_count; j++)
	{
		allow.push_back(1);
		isextreme.push_back(0);
		bmin.setMin(verts[j]);
		bmax.setMax(verts[j]);
	}
	cbtScalar epsilon = (bmax - bmin).length() * cbtScalar(0.001);
	cbtAssert(epsilon != 0.0);

	cbtInt4 p = FindSimplex(verts, verts_count, allow);
	if (p.x == -1) return 0;  // simplex failed

	cbtVector3 center = (verts[p[0]] + verts[p[1]] + verts[p[2]] + verts[p[3]]) / cbtScalar(4.0);  // a valid interior point
	cbtHullTriangle *t0 = allocateTriangle(p[2], p[3], p[1]);
    t0->n = cbtInt3(2, 3, 1);
	cbtHullTriangle *t1 = allocateTriangle(p[3], p[2], p[0]);
    t1->n = cbtInt3(3, 2, 0);
	cbtHullTriangle *t2 = allocateTriangle(p[0], p[1], p[3]);
    t2->n = cbtInt3(0, 1, 3);
	cbtHullTriangle *t3 = allocateTriangle(p[1], p[0], p[2]);
    t3->n = cbtInt3(1, 0, 2);
	isextreme[p[0]] = isextreme[p[1]] = isextreme[p[2]] = isextreme[p[3]] = 1;
	checkit(t0);
	checkit(t1);
	checkit(t2);
	checkit(t3);

	for (j = 0; j < m_tris.size(); j++)
	{
		cbtHullTriangle *t = m_tris[j];
		cbtAssert(t);
		cbtAssert(t->vmax < 0);
		cbtVector3 n = TriNormal(verts[(*t)[0]], verts[(*t)[1]], verts[(*t)[2]]);
		t->vmax = maxdirsterid(verts, verts_count, n, allow);
		t->rise = cbtDot(n, verts[t->vmax] - verts[(*t)[0]]);
	}
	cbtHullTriangle *te;
	vlimit -= 4;
	while (vlimit > 0 && ((te = extrudable(epsilon)) != 0))
	{
		//int3 ti=*te;
		int v = te->vmax;
		cbtAssert(v != -1);
		cbtAssert(!isextreme[v]);  // wtf we've already done this vertex
		isextreme[v] = 1;
		//if(v==p0 || v==p1 || v==p2 || v==p3) continue; // done these already
		j = m_tris.size();
		while (j--)
		{
			if (!m_tris[j]) continue;
            cbtInt3 t = *m_tris[j];
			if (above(verts, t, verts[v], cbtScalar(0.01) * epsilon))
			{
				extrude(m_tris[j], v);
			}
		}
		// now check for those degenerate cases where we have a flipped triangle or a really skinny triangle
		j = m_tris.size();
		while (j--)
		{
			if (!m_tris[j]) continue;
			if (!hasvert(*m_tris[j], v)) break;
            cbtInt3 nt = *m_tris[j];
			if (above(verts, nt, center, cbtScalar(0.01) * epsilon) || cbtCross(verts[nt[1]] - verts[nt[0]], verts[nt[2]] - verts[nt[1]]).length() < epsilon * epsilon * cbtScalar(0.1))
			{
				cbtHullTriangle *nb = m_tris[m_tris[j]->n[0]];
				cbtAssert(nb);
				cbtAssert(!hasvert(*nb, v));
				cbtAssert(nb->id < j);
				extrude(nb, v);
				j = m_tris.size();
			}
		}
		j = m_tris.size();
		while (j--)
		{
			cbtHullTriangle *t = m_tris[j];
			if (!t) continue;
			if (t->vmax >= 0) break;
			cbtVector3 n = TriNormal(verts[(*t)[0]], verts[(*t)[1]], verts[(*t)[2]]);
			t->vmax = maxdirsterid(verts, verts_count, n, allow);
			if (isextreme[t->vmax])
			{
				t->vmax = -1;  // already done that vertex - algorithm needs to be able to terminate.
			}
			else
			{
				t->rise = cbtDot(n, verts[t->vmax] - verts[(*t)[0]]);
			}
		}
		vlimit--;
	}
	return 1;
}